

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1_parser.c
# Opt level: O0

int consume_request_line(http1_fio_parser_args_s *args,uint8_t *start,uint8_t *end)

{
  uint8_t uVar1;
  int iVar2;
  uint8_t *local_40;
  uint8_t *host_end;
  uint8_t *host_start;
  uint8_t *tmp;
  uint8_t *end_local;
  uint8_t *start_local;
  http1_fio_parser_args_s *args_local;
  
  host_end = (uint8_t *)0x0;
  local_40 = (uint8_t *)0x0;
  host_start = start;
  tmp = end;
  end_local = start;
  start_local = (uint8_t *)args;
  uVar1 = seek2ch(&host_start,end,' ');
  if (uVar1 == '\0') {
    return -1;
  }
  iVar2 = (**(code **)(start_local + 0x28))
                    (*(undefined8 *)start_local,end_local,(long)host_start - (long)end_local);
  if (iVar2 != 0) {
    return -1;
  }
  end_local = host_start + 1;
  if ((((*end_local == 'h') && (host_start[2] == 't')) && (host_start[3] == 't')) &&
     (host_start[4] == 'p')) {
    if (((host_start[5] == ':') && (host_start[6] == '/')) && (host_start[7] == '/')) {
      end_local = host_start + 8;
    }
    else {
      if (((host_start[5] != 's') || (host_start[6] != ':')) ||
         ((host_start[7] != '/' || (host_start[8] != '/')))) goto LAB_0018b18b;
      end_local = host_start + 9;
    }
    local_40 = end_local;
    host_end = end_local;
    host_start = end_local;
    uVar1 = seek2ch(&host_start,tmp,' ');
    if (uVar1 == '\0') {
      return -1;
    }
    *host_start = ' ';
    uVar1 = seek2ch(&local_40,host_start,'/');
    if (uVar1 == '\0') {
      iVar2 = (**(code **)(start_local + 0x38))(*(undefined8 *)start_local,"/",1);
      if (iVar2 != 0) {
        return -1;
      }
      goto LAB_0018b2b3;
    }
    *local_40 = '/';
    end_local = local_40;
  }
LAB_0018b18b:
  host_start = end_local;
  uVar1 = seek2ch(&host_start,tmp,'?');
  if (uVar1 == '\0') {
    host_start = end_local;
    uVar1 = seek2ch(&host_start,tmp,' ');
    if (uVar1 == '\0') {
      return -1;
    }
    iVar2 = (**(code **)(start_local + 0x38))
                      (*(undefined8 *)start_local,end_local,(long)host_start - (long)end_local);
    if (iVar2 != 0) {
      return -1;
    }
  }
  else {
    iVar2 = (**(code **)(start_local + 0x38))
                      (*(undefined8 *)start_local,end_local,(long)host_start - (long)end_local);
    if (iVar2 != 0) {
      return -1;
    }
    host_start = host_start + 1;
    end_local = host_start;
    uVar1 = seek2ch(&host_start,tmp,' ');
    if (uVar1 == '\0') {
      return -1;
    }
    if ((0 < (long)host_start - (long)end_local) &&
       (iVar2 = (**(code **)(start_local + 0x40))
                          (*(undefined8 *)start_local,end_local,(long)host_start - (long)end_local),
       iVar2 != 0)) {
      return -1;
    }
  }
LAB_0018b2b3:
  end_local = host_start + 1;
  if (host_start + 6 < tmp) {
    iVar2 = (**(code **)(start_local + 0x48))
                      (*(undefined8 *)start_local,end_local,(long)tmp - (long)end_local);
    if (iVar2 == 0) {
      if ((host_end == (uint8_t *)0x0) ||
         (iVar2 = (**(code **)(start_local + 0x50))
                            (*(undefined8 *)start_local,"host",4,host_end,
                             (long)local_40 - (long)host_end), iVar2 == 0)) {
        args_local._4_4_ = 0;
      }
      else {
        args_local._4_4_ = -1;
      }
    }
    else {
      args_local._4_4_ = -1;
    }
  }
  else {
    args_local._4_4_ = -1;
  }
  return args_local._4_4_;
}

Assistant:

inline static int consume_request_line(struct http1_fio_parser_args_s *args,
                                       uint8_t *start, uint8_t *end) {
  uint8_t *tmp = start;
  uint8_t *host_start = NULL;
  uint8_t *host_end = NULL;
  if (!seek2ch(&tmp, end, ' '))
    return -1;
  if (args->on_method(args->parser, (char *)start, tmp - start))
    return -1;
  tmp = start = tmp + 1;
  if (start[0] == 'h' && start[1] == 't' && start[2] == 't' &&
      start[3] == 'p') {
    if (start[4] == ':' && start[5] == '/' && start[6] == '/') {
      /* Request URI is in long form... emulate Host header instead. */
      tmp = host_end = host_start = (start += 7);
    } else if (start[4] == 's' && start[5] == ':' && start[6] == '/' &&
               start[7] == '/') {
      /* Secure request is in long form... emulate Host header instead. */
      tmp = host_end = host_start = (start += 8);
    } else
      goto review_path;
    if (!seek2ch(&tmp, end, ' '))
      return -1;
    *tmp = ' ';
    if (!seek2ch(&host_end, tmp, '/')) {
      if (args->on_path(args->parser, (char *)"/", 1))
        return -1;
      goto start_version;
    }
    host_end[0] = '/';
    start = host_end;
  }
review_path:
  tmp = start;
  if (seek2ch(&tmp, end, '?')) {
    if (args->on_path(args->parser, (char *)start, tmp - start))
      return -1;
    tmp = start = tmp + 1;
    if (!seek2ch(&tmp, end, ' '))
      return -1;
    if (tmp - start > 0 &&
        args->on_query(args->parser, (char *)start, tmp - start))
      return -1;
  } else {
    tmp = start;
    if (!seek2ch(&tmp, end, ' '))
      return -1;
    if (args->on_path(args->parser, (char *)start, tmp - start))
      return -1;
  }
start_version:
  start = tmp + 1;
  if (start + 5 >= end) /* require "HTTP/" */
    return -1;
  if (args->on_http_version(args->parser, (char *)start, end - start))
    return -1;
  /* */
  if (host_start && args->on_header(args->parser, (char *)"host", 4,
                                    (char *)host_start, host_end - host_start))
    return -1;
  return 0;
}